

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scripting_window.cpp
# Opt level: O0

Am_Object Am_Script_Window_Initialize(void)

{
  Am_Slot_Key AVar1;
  Am_Object *pAVar2;
  Am_Object *pAVar3;
  Am_Method_Wrapper *pAVar4;
  Am_Wrapper *pAVar5;
  Am_Value_List *pAVar6;
  Am_Constraint *pAVar7;
  Am_Value_List *pAVar8;
  Am_Object *pAVar9;
  Am_Object_Data *in_RDI;
  Am_Object local_3a8;
  Am_Object local_3a0;
  Am_Object local_398;
  Am_Object local_390;
  Am_Formula local_388;
  Am_Object local_378;
  Am_Object local_370;
  Am_Object local_368;
  Am_Object local_360;
  Am_Object local_358;
  Am_Object local_350;
  Am_Object local_348;
  Am_Object local_340;
  Am_Value_List local_338;
  Am_Object local_328;
  Am_Object local_320;
  Am_Object local_318;
  Am_Object local_310;
  Am_Object local_308;
  Am_Input_Char local_2fc;
  Am_Value local_2f8;
  Am_Object local_2e8;
  Am_Object local_2e0;
  Am_Object local_2d8;
  Am_Input_Char local_2cc;
  Am_Value local_2c8;
  Am_Object local_2b8;
  Am_Object local_2b0;
  Am_Object local_2a8;
  Am_Formula local_2a0;
  Am_Formula local_290;
  Am_Formula local_280;
  Am_Object local_270;
  Am_Object local_268;
  Am_Object local_260;
  Am_Object local_258;
  Am_Formula local_250;
  Am_Object local_240;
  Am_Object local_238;
  Am_Formula local_230;
  Am_Formula local_220;
  Am_Formula local_210;
  Am_Object local_200;
  Am_Object local_1f8;
  Am_Formula local_1f0;
  Am_Formula local_1e0;
  Am_Object local_1d0;
  Am_Object local_1c8;
  Am_Formula local_1c0;
  Am_Formula local_1b0;
  Am_Object local_1a0;
  Am_Object local_198;
  Am_Object local_190;
  Am_Object local_188;
  Am_Formula local_180;
  Am_Font local_170;
  Am_Object local_168;
  Am_Object local_160;
  Am_Object local_158;
  Am_Object local_150;
  Am_Font local_148;
  Am_Formula local_140;
  Am_Object local_130;
  Am_Object local_128;
  Am_Object local_120;
  Am_Object local_118;
  Am_Object local_110;
  Am_Object sg;
  Am_Object local_100;
  Am_Object local_f8;
  Am_Object local_f0;
  Am_Object local_e8;
  Am_Object local_e0;
  Am_Object local_d8;
  Am_Object local_d0;
  Am_Object local_c8;
  Am_Object local_c0;
  Am_Object local_b8;
  Am_Object local_b0;
  Am_Object local_a8;
  Am_Object local_a0;
  Am_Value_List local_98;
  Am_Object local_88;
  Am_Object local_80;
  Am_Object local_78;
  Am_Object local_70;
  Am_Object local_68;
  Am_Object local_60;
  Am_Object local_58;
  Am_Object local_50;
  Am_Value_List local_48 [2];
  Am_Object local_28;
  undefined1 local_20 [8];
  Am_Value_List l;
  
  Am_Value_List::Am_Value_List((Am_Value_List *)local_20);
  Am_Object::Create(&local_28,(char *)&Am_Command);
  pAVar2 = Am_Object::Set(&local_28,0x150,"File",0);
  pAVar2 = Am_Object::Set(pAVar2,0x154,true,0);
  Am_Value_List::Am_Value_List(local_48);
  Am_Object::Create(&local_50,(char *)&Am_Standard_OK_Command);
  pAVar3 = Am_Object::Set(&local_50,0x154,-1,0);
  pAVar4 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&am_script_ok);
  pAVar3 = Am_Object::Set(pAVar3,0xca,pAVar4,0);
  pAVar5 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar3);
  pAVar6 = Am_Value_List::Add(local_48,pAVar5,Am_TAIL,true);
  Am_Object::Create(&local_58,(char *)&Am_Command);
  pAVar3 = Am_Object::Set(&local_58,0x150,"Cancel",0);
  pAVar3 = Am_Object::Set(pAVar3,0x154,-1,0);
  pAVar4 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&script_window_cancel);
  pAVar3 = Am_Object::Set(pAVar3,0xca,pAVar4,0);
  pAVar5 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar3);
  pAVar6 = Am_Value_List::Add(pAVar6,pAVar5,Am_TAIL,true);
  Am_Object::Create(&local_60,(char *)&Am_Command);
  pAVar3 = Am_Object::Set(&local_60,0x150,"Remove Script",0);
  pAVar7 = Am_Formula::operator_cast_to_Am_Constraint_(&ok_to_remove_formula);
  pAVar3 = Am_Object::Set(pAVar3,0xcc,pAVar7,0);
  pAVar3 = Am_Object::Set(pAVar3,0x154,-1,0);
  pAVar4 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&am_script_remove);
  pAVar3 = Am_Object::Set(pAVar3,0xca,pAVar4,0);
  pAVar5 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar3);
  pAVar6 = Am_Value_List::Add(pAVar6,pAVar5,Am_TAIL,true);
  Am_Object::Create(&local_68,(char *)&Am_Command);
  pAVar3 = Am_Object::Set(&local_68,0x150,"Execute Script",0);
  pAVar3 = Am_Object::Set(pAVar3,0x154,-1,0);
  pAVar4 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&am_script_execute);
  pAVar3 = Am_Object::Set(pAVar3,0xca,pAVar4,0);
  pAVar5 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar3);
  pAVar6 = Am_Value_List::Add(pAVar6,pAVar5,Am_TAIL,true);
  Am_Object::Create(&local_70,(char *)&Am_Command);
  pAVar3 = Am_Object::Set(&local_70,0x150,"Select Members",0);
  pAVar3 = Am_Object::Set(pAVar3,0x154,-1,0);
  pAVar4 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&am_script_select_members);
  pAVar3 = Am_Object::Set(pAVar3,0xca,pAVar4,0);
  pAVar5 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar3);
  pAVar6 = Am_Value_List::Add(pAVar6,pAVar5,Am_TAIL,true);
  Am_Object::Create(&local_78,(char *)&Am_Menu_Line_Command);
  pAVar5 = Am_Object::operator_cast_to_Am_Wrapper_(&local_78);
  pAVar6 = Am_Value_List::Add(pAVar6,pAVar5,Am_TAIL,true);
  Am_Object::Create(&local_80,(char *)&Am_About_Amulet_Command);
  pAVar5 = Am_Object::operator_cast_to_Am_Wrapper_(&local_80);
  pAVar6 = Am_Value_List::Add(pAVar6,pAVar5,Am_TAIL,true);
  pAVar5 = Am_Value_List::operator_cast_to_Am_Wrapper_(pAVar6);
  pAVar2 = Am_Object::Set(pAVar2,0xa2,pAVar5,0);
  pAVar5 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar2);
  pAVar6 = Am_Value_List::Add((Am_Value_List *)local_20,pAVar5,Am_TAIL,true);
  Am_Object::Create(&local_88,(char *)&Am_Command);
  pAVar2 = Am_Object::Set(&local_88,0x150,"Edit",0);
  pAVar2 = Am_Object::Set(pAVar2,0x154,true,0);
  Am_Value_List::Am_Value_List(&local_98);
  Am_Object::Create(&local_a0,(char *)&Am_Undo_Command);
  pAVar5 = Am_Object::operator_cast_to_Am_Wrapper_(&local_a0);
  pAVar8 = Am_Value_List::Add(&local_98,pAVar5,Am_TAIL,true);
  Am_Object::Create(&local_a8,(char *)&Am_Redo_Command);
  pAVar5 = Am_Object::operator_cast_to_Am_Wrapper_(&local_a8);
  pAVar8 = Am_Value_List::Add(pAVar8,pAVar5,Am_TAIL,true);
  Am_Object::Create(&local_b0,(char *)&Am_Command);
  pAVar3 = Am_Object::Set(&local_b0,0x150,"Cut",0);
  pAVar3 = Am_Object::Set(pAVar3,0xcc,false,0);
  pAVar5 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar3);
  pAVar8 = Am_Value_List::Add(pAVar8,pAVar5,Am_TAIL,true);
  Am_Object::Create(&local_b8,(char *)&Am_Command);
  pAVar3 = Am_Object::Set(&local_b8,0x150,"Copy",0);
  pAVar3 = Am_Object::Set(pAVar3,0xcc,false,0);
  pAVar5 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar3);
  pAVar8 = Am_Value_List::Add(pAVar8,pAVar5,Am_TAIL,true);
  Am_Object::Create(&local_c0,(char *)&Am_Command);
  pAVar3 = Am_Object::Set(&local_c0,0x150,"Paste",0);
  pAVar3 = Am_Object::Set(pAVar3,0xcc,false,0);
  pAVar5 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar3);
  pAVar8 = Am_Value_List::Add(pAVar8,pAVar5,Am_TAIL,true);
  Am_Object::Create(&local_c8,(char *)&Am_Command);
  pAVar3 = Am_Object::Set(&local_c8,0x150,"Insert Commands Before",0);
  pAVar7 = Am_Formula::operator_cast_to_Am_Constraint_(&am_insert_commands_ok);
  pAVar3 = Am_Object::Set(pAVar3,0xcc,pAVar7,0);
  pAVar4 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&am_insert_commands_before);
  pAVar3 = Am_Object::Set(pAVar3,0xca,pAVar4,0);
  pAVar4 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&am_edit_commands_list_undo);
  pAVar3 = Am_Object::Set(pAVar3,0x146,pAVar4,0);
  pAVar4 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&am_edit_commands_list_undo);
  pAVar3 = Am_Object::Set(pAVar3,0x147,pAVar4,0);
  pAVar5 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar3);
  pAVar8 = Am_Value_List::Add(pAVar8,pAVar5,Am_TAIL,true);
  Am_Object::Create(&local_d0,(char *)&Am_Command);
  pAVar3 = Am_Object::Set(&local_d0,0x150,"Insert Commands After",0);
  pAVar7 = Am_Formula::operator_cast_to_Am_Constraint_(&am_insert_commands_ok);
  pAVar3 = Am_Object::Set(pAVar3,0xcc,pAVar7,0);
  pAVar4 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&am_insert_commands_after);
  pAVar3 = Am_Object::Set(pAVar3,0xca,pAVar4,0);
  pAVar4 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&am_edit_commands_list_undo);
  pAVar3 = Am_Object::Set(pAVar3,0x146,pAVar4,0);
  pAVar4 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&am_edit_commands_list_undo);
  pAVar3 = Am_Object::Set(pAVar3,0x147,pAVar4,0);
  pAVar5 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar3);
  pAVar8 = Am_Value_List::Add(pAVar8,pAVar5,Am_TAIL,true);
  Am_Object::Create(&local_d8,(char *)&Am_Command);
  pAVar3 = Am_Object::Set(&local_d8,0x150,"Delete Commands",0);
  pAVar7 = Am_Formula::operator_cast_to_Am_Constraint_(&am_delete_commands_ok);
  pAVar3 = Am_Object::Set(pAVar3,0xcc,pAVar7,0);
  pAVar4 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&am_delete_script_commands);
  pAVar3 = Am_Object::Set(pAVar3,0xca,pAVar4,0);
  pAVar4 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&am_edit_commands_list_undo);
  pAVar3 = Am_Object::Set(pAVar3,0x146,pAVar4,0);
  pAVar4 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&am_edit_commands_list_undo);
  pAVar3 = Am_Object::Set(pAVar3,0x147,pAVar4,0);
  pAVar5 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar3);
  pAVar8 = Am_Value_List::Add(pAVar8,pAVar5,Am_TAIL,true);
  Am_Object::Create(&local_e0,(char *)&Am_Menu_Line_Command);
  pAVar5 = Am_Object::operator_cast_to_Am_Wrapper_(&local_e0);
  pAVar8 = Am_Value_List::Add(pAVar8,pAVar5,Am_TAIL,true);
  Am_Object::Create(&local_e8,(char *)&Am_Command);
  pAVar3 = Am_Object::Set(&local_e8,0x150,"Generalize",0);
  pAVar7 = Am_Formula::operator_cast_to_Am_Constraint_(&am_generalize_script_active);
  pAVar3 = Am_Object::Set(pAVar3,0xcc,pAVar7,0);
  pAVar4 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&am_do_generalize_script);
  pAVar3 = Am_Object::Set(pAVar3,0xca,pAVar4,0);
  pAVar5 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar3);
  pAVar8 = Am_Value_List::Add(pAVar8,pAVar5,Am_TAIL,true);
  Am_Object::Create(&local_f0,(char *)&Am_Menu_Line_Command);
  pAVar5 = Am_Object::operator_cast_to_Am_Wrapper_(&local_f0);
  pAVar8 = Am_Value_List::Add(pAVar8,pAVar5,Am_TAIL,true);
  Am_Object::Create(&local_f8,(char *)&Am_Command);
  pAVar3 = Am_Object::Set(&local_f8,0x150,"How Invoked...",0);
  pAVar4 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&pop_up_invoke_options);
  pAVar3 = Am_Object::Set(pAVar3,0xca,pAVar4,0);
  pAVar5 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar3);
  pAVar8 = Am_Value_List::Add(pAVar8,pAVar5,Am_TAIL,true);
  pAVar5 = Am_Value_List::operator_cast_to_Am_Wrapper_(pAVar8);
  pAVar2 = Am_Object::Set(pAVar2,0xa2,pAVar5,0);
  pAVar5 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar2);
  Am_Value_List::Add(pAVar6,pAVar5,Am_TAIL,true);
  Am_Object::~Am_Object(&local_f8);
  Am_Object::~Am_Object(&local_f0);
  Am_Object::~Am_Object(&local_e8);
  Am_Object::~Am_Object(&local_e0);
  Am_Object::~Am_Object(&local_d8);
  Am_Object::~Am_Object(&local_d0);
  Am_Object::~Am_Object(&local_c8);
  Am_Object::~Am_Object(&local_c0);
  Am_Object::~Am_Object(&local_b8);
  Am_Object::~Am_Object(&local_b0);
  Am_Object::~Am_Object(&local_a8);
  Am_Object::~Am_Object(&local_a0);
  Am_Value_List::~Am_Value_List(&local_98);
  Am_Object::~Am_Object(&local_88);
  Am_Object::~Am_Object(&local_80);
  Am_Object::~Am_Object(&local_78);
  Am_Object::~Am_Object(&local_70);
  Am_Object::~Am_Object(&local_68);
  Am_Object::~Am_Object(&local_60);
  Am_Object::~Am_Object(&local_58);
  Am_Object::~Am_Object(&local_50);
  Am_Value_List::~Am_Value_List(local_48);
  Am_Object::~Am_Object(&local_28);
  Am_Object::Create(&local_100,(char *)&Am_Window);
  pAVar4 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&script_window_destroy_method);
  pAVar2 = Am_Object::Set(&local_100,0x89,pAVar4,0);
  pAVar5 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_Motif_Light_Green);
  pAVar2 = Am_Object::Set(pAVar2,0x6a,pAVar5,0);
  pAVar2 = Am_Object::Set(pAVar2,0x6c,"Script for Commands",0);
  pAVar2 = Am_Object::Set(pAVar2,0x6d,"Script Commands",0);
  pAVar2 = Am_Object::Set(pAVar2,0x66,0x212,0);
  pAVar2 = Am_Object::Set(pAVar2,0x67,400,0);
  pAVar2 = Am_Object::Set(pAVar2,0x69,false,0);
  AVar1 = Am_SCRIPT_EXECUTE_COMMAND;
  pAVar5 = Am_Object::operator_cast_to_Am_Wrapper_(&Am_No_Object);
  pAVar2 = Am_Object::Add(pAVar2,AVar1,pAVar5,0);
  AVar1 = Am_SHOW_SCRIPT_COMMAND;
  pAVar5 = Am_Object::operator_cast_to_Am_Wrapper_(&Am_No_Object);
  pAVar2 = Am_Object::Add(pAVar2,AVar1,pAVar5,0);
  Am_Object::Create(&sg,(char *)&Am_Multiple_Undo_Object);
  pAVar5 = Am_Object::operator_cast_to_Am_Wrapper_(&sg);
  pAVar2 = Am_Object::Set(pAVar2,0x174,pAVar5,0);
  Am_Object::operator=(&Am_Script_Window,pAVar2);
  Am_Object::~Am_Object(&sg);
  Am_Object::~Am_Object(&local_100);
  Am_Object::Am_Object(&local_110);
  AVar1 = Am_UNDO_MENU_BAR;
  Am_Object::Create(&local_120,(char *)&Am_Menu_Bar);
  pAVar5 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_Motif_Light_Green);
  pAVar2 = Am_Object::Set(&local_120,0x6a,pAVar5,0);
  pAVar5 = Am_Value_List::operator_cast_to_Am_Wrapper_((Am_Value_List *)local_20);
  pAVar2 = Am_Object::Set(pAVar2,0xa2,pAVar5,0);
  Am_Object::Am_Object(&local_118,pAVar2);
  pAVar2 = Am_Object::Add_Part(&Am_Script_Window,AVar1,&local_118,0);
  Am_Object::Create(&local_130,(char *)&Am_Text);
  pAVar3 = Am_Object::Set(&local_130,100,4,0);
  Am_Bottom_Of_Sibling((Am_Slot_Key)&local_140,(uint)Am_UNDO_MENU_BAR,1.0);
  pAVar7 = Am_Formula::operator_cast_to_Am_Constraint_(&local_140);
  pAVar3 = Am_Object::Set(pAVar3,0x65,pAVar7,0);
  pAVar3 = Am_Object::Set(pAVar3,0x66,0xd2,0);
  pAVar3 = Am_Object::Set(pAVar3,0x67,0x13,0);
  pAVar3 = Am_Object::Set(pAVar3,0xab,"Script Editor",0);
  Am_Font::Am_Font(&local_148,Am_FONT_FIXED,true,false,false,Am_FONT_LARGE);
  pAVar5 = Am_Font::operator_cast_to_Am_Wrapper_(&local_148);
  pAVar3 = Am_Object::Set(pAVar3,0xac,pAVar5,0);
  pAVar5 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_Black);
  pAVar3 = Am_Object::Set(pAVar3,0x6b,pAVar5,0);
  pAVar5 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_Motif_Light_Green);
  pAVar3 = Am_Object::Set(pAVar3,0x6a,pAVar5,0);
  Am_Object::Am_Object(&local_128,pAVar3);
  pAVar2 = Am_Object::Add_Part(pAVar2,0x150,&local_128,0);
  AVar1 = Am_NAME_OBJECT;
  Am_Object::Create(&local_168,(char *)&Am_Text_Input_Widget);
  Am_Font::Am_Font(&local_170,Am_FONT_FIXED,true,false,false,Am_FONT_MEDIUM);
  pAVar5 = Am_Font::operator_cast_to_Am_Wrapper_(&local_170);
  pAVar3 = Am_Object::Set(&local_168,0xac,pAVar5,0);
  pAVar3 = Am_Object::Set(pAVar3,100,10,0);
  Am_Bottom_Of_Sibling((Am_Slot_Key)&local_180,0x150,1.0);
  pAVar7 = Am_Formula::operator_cast_to_Am_Constraint_(&local_180);
  pAVar3 = Am_Object::Set(pAVar3,0x65,pAVar7,0);
  pAVar3 = Am_Object::Set(pAVar3,0x66,0xd4,0);
  pAVar3 = Am_Object::Set(pAVar3,0x67,0x19,0);
  Am_Object::Get_Object(&local_160,(Am_Slot_Key)pAVar3,0xc5);
  pAVar3 = Am_Object::Set(&local_160,0x150,"Script Name:",0);
  Am_Object::Get_Owner(&local_158,(Am_Slot_Flags)pAVar3);
  pAVar5 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_Motif_Light_Green);
  pAVar3 = Am_Object::Set(&local_158,0x6a,pAVar5,0);
  Am_Object::Am_Object(&local_150,pAVar3);
  pAVar2 = Am_Object::Add_Part(pAVar2,AVar1,&local_150,0);
  Am_Object::Create(&local_1a0,(char *)&Am_Button);
  pAVar3 = Am_Object::Set(&local_1a0,0x1c7,false,0);
  Am_Right_Of_Sibling((Am_Slot_Key)&local_1b0,(uint)Am_NAME_OBJECT,1.0);
  pAVar7 = Am_Formula::operator_cast_to_Am_Constraint_(&local_1b0);
  pAVar3 = Am_Object::Set(pAVar3,100,pAVar7,0);
  Am_From_Sibling((Am_Slot_Key)&local_1c0,Am_NAME_OBJECT);
  pAVar7 = Am_Formula::operator_cast_to_Am_Constraint_(&local_1c0);
  pAVar3 = Am_Object::Set(pAVar3,0x65,pAVar7,0);
  Am_Object::Get_Object(&local_198,(Am_Slot_Key)pAVar3,0xc5);
  pAVar3 = Am_Object::Set(&local_198,0x150,"How Invoked...",0);
  pAVar4 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&pop_up_invoke_options);
  pAVar3 = Am_Object::Set(pAVar3,0xca,pAVar4,0);
  Am_Object::Get_Owner(&local_190,(Am_Slot_Flags)pAVar3);
  pAVar5 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_Motif_Light_Green);
  pAVar3 = Am_Object::Set(&local_190,0x6a,pAVar5,0);
  Am_Object::Am_Object(&local_188,pAVar3);
  pAVar2 = Am_Object::Add_Part(pAVar2,0x152,&local_188,0);
  Am_Object::Create(&local_1d0,(char *)&Am_Text);
  Am_Right_Of_Sibling((Am_Slot_Key)&local_1e0,0x152,1.0);
  pAVar7 = Am_Formula::operator_cast_to_Am_Constraint_(&local_1e0);
  pAVar3 = Am_Object::Set(&local_1d0,100,pAVar7,0);
  Am_From_Sibling((Am_Slot_Key)&local_1f0,Am_NAME_OBJECT);
  pAVar7 = Am_Formula::operator_cast_to_Am_Constraint_(&local_1f0);
  pAVar3 = Am_Object::Set(pAVar3,0x65,pAVar7,0);
  pAVar7 = Am_Formula::operator_cast_to_Am_Constraint_(&gen_how_invoke_text);
  pAVar3 = Am_Object::Set(pAVar3,0xab,pAVar7,0);
  Am_Object::Am_Object(&local_1c8,pAVar3);
  pAVar2 = Am_Object::Add_Part(pAVar2,&local_1c8,true,0);
  Am_Object::Create(&local_200,(char *)&Am_Border_Rectangle);
  pAVar3 = Am_Object::Set(&local_200,100,10,0);
  Am_Bottom_Of_Sibling((Am_Slot_Key)&local_210,0x152,1.0);
  pAVar7 = Am_Formula::operator_cast_to_Am_Constraint_(&local_210);
  pAVar3 = Am_Object::Set(pAVar3,0x65,pAVar7,0);
  Am_From_Owner((Am_Slot_Key)&local_220,0x66,1.0);
  pAVar7 = Am_Formula::operator_cast_to_Am_Constraint_(&local_220);
  pAVar3 = Am_Object::Set(pAVar3,0x66,pAVar7,0);
  Am_Rest_Of_Height_Above((Am_Slot_Key)&local_230,(uint)Am_UNDO_OPTIONS);
  pAVar7 = Am_Formula::operator_cast_to_Am_Constraint_(&local_230);
  pAVar3 = Am_Object::Set(pAVar3,0x67,pAVar7,0);
  pAVar3 = Am_Object::Set(pAVar3,0x172,0,0);
  pAVar5 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_Motif_Light_Green);
  pAVar3 = Am_Object::Set(pAVar3,0x6a,pAVar5,0);
  Am_Object::Am_Object(&local_1f8,pAVar3);
  pAVar2 = Am_Object::Add_Part(pAVar2,&local_1f8,true,0);
  Am_Object::Create(&local_240,(char *)&Am_Text);
  pAVar3 = Am_Object::Set(&local_240,100,0x10,0);
  Am_Bottom_Of_Sibling((Am_Slot_Key)&local_250,0x152,1.0);
  pAVar7 = Am_Formula::operator_cast_to_Am_Constraint_(&local_250);
  pAVar3 = Am_Object::Set(pAVar3,0x65,pAVar7,0);
  pAVar3 = Am_Object::Set(pAVar3,0xab,"Commands:",0);
  pAVar5 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_Black);
  pAVar3 = Am_Object::Set(pAVar3,0x6b,pAVar5,0);
  Am_Object::Am_Object(&local_238,pAVar3);
  pAVar2 = Am_Object::Add_Part(pAVar2,0x151,&local_238,0);
  AVar1 = Am_UNDO_SCROLL_GROUP;
  Am_Object::Create(&local_270,(char *)&Am_Scrolling_Menu);
  pAVar3 = Am_Object::Set(&local_270,100,0x12,0);
  Am_Bottom_Of_Sibling((Am_Slot_Key)&local_280,0x151,1.0);
  pAVar7 = Am_Formula::operator_cast_to_Am_Constraint_(&local_280);
  pAVar3 = Am_Object::Set(pAVar3,0x65,pAVar7,0);
  Am_From_Owner((Am_Slot_Key)&local_290,0x66,1.0);
  pAVar7 = Am_Formula::operator_cast_to_Am_Constraint_(&local_290);
  pAVar3 = Am_Object::Set(pAVar3,0x66,pAVar7,0);
  Am_Rest_Of_Height_Above((Am_Slot_Key)&local_2a0,(uint)Am_UNDO_OPTIONS);
  pAVar7 = Am_Formula::operator_cast_to_Am_Constraint_(&local_2a0);
  pAVar3 = Am_Object::Set(pAVar3,0x67,pAVar7,0);
  pAVar5 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_Motif_Light_Green);
  pAVar3 = Am_Object::Set(pAVar3,0x6a,pAVar5,0);
  pAVar3 = Am_Object::Set(pAVar3,0x18a,true,0);
  Am_Object::Get_Object(&local_268,(Am_Slot_Key)pAVar3,0xc5);
  pAVar3 = Am_Object::Set(&local_268,0x154,-1,0);
  Am_Object::Get_Owner(&local_260,(Am_Slot_Flags)pAVar3);
  Am_Object::Create(&local_2b8,(char *)&Am_One_Shot_Interactor);
  Am_Input_Char::Am_Input_Char(&local_2cc,"left_down",true);
  Am_Input_Char::operator_cast_to_Am_Value((Am_Input_Char *)&local_2c8);
  pAVar3 = Am_Object::Set(&local_2b8,0xb9,&local_2c8,0);
  pAVar3 = Am_Object::Set(pAVar3,0xcd,10.0,0);
  pAVar4 = Am_Where_Method::operator_cast_to_Am_Method_Wrapper_(&am_on_selectable_line_part);
  pAVar3 = Am_Object::Set(pAVar3,0xba,pAVar4,0);
  Am_Object::Get_Object(&local_2b0,(Am_Slot_Key)pAVar3,0xc5);
  pAVar4 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&am_select_line_part);
  pAVar3 = Am_Object::Set(&local_2b0,0xca,pAVar4,0);
  pAVar3 = Am_Object::Set(pAVar3,0x154,-1,0);
  Am_Object::Get_Owner(&local_2a8,(Am_Slot_Flags)pAVar3);
  pAVar3 = Am_Object::Add_Part(&local_260,0x1ac,&local_2a8,0);
  Am_Object::Create(&local_2e8,(char *)&Am_One_Shot_Interactor);
  Am_Input_Char::Am_Input_Char(&local_2fc,"double_left_down",true);
  Am_Input_Char::operator_cast_to_Am_Value((Am_Input_Char *)&local_2f8);
  pAVar9 = Am_Object::Set(&local_2e8,0xb9,&local_2f8,0);
  pAVar9 = Am_Object::Set(pAVar9,0xcd,10.0,0);
  pAVar4 = Am_Where_Method::operator_cast_to_Am_Method_Wrapper_(&am_on_selectable_line_part);
  pAVar9 = Am_Object::Set(pAVar9,0xba,pAVar4,0);
  Am_Object::Get_Object(&local_2e0,(Am_Slot_Key)pAVar9,0xc5);
  pAVar4 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&am_generalize_script_double_click)
  ;
  pAVar9 = Am_Object::Set(&local_2e0,0xca,pAVar4,0);
  pAVar9 = Am_Object::Set(pAVar9,0x154,-1,0);
  Am_Object::Get_Owner(&local_2d8,(Am_Slot_Flags)pAVar9);
  pAVar3 = Am_Object::Add_Part(pAVar3,0x1b8,&local_2d8,0);
  pAVar3 = Am_Object::operator=(&local_110,pAVar3);
  Am_Object::Am_Object(&local_258,pAVar3);
  Am_Object::Add_Part(pAVar2,AVar1,&local_258,0);
  Am_Object::~Am_Object(&local_258);
  Am_Object::~Am_Object(&local_2d8);
  Am_Object::~Am_Object(&local_2e0);
  Am_Value::~Am_Value(&local_2f8);
  Am_Object::~Am_Object(&local_2e8);
  Am_Object::~Am_Object(&local_2a8);
  Am_Object::~Am_Object(&local_2b0);
  Am_Value::~Am_Value(&local_2c8);
  Am_Object::~Am_Object(&local_2b8);
  Am_Object::~Am_Object(&local_260);
  Am_Object::~Am_Object(&local_268);
  Am_Formula::~Am_Formula(&local_2a0);
  Am_Formula::~Am_Formula(&local_290);
  Am_Formula::~Am_Formula(&local_280);
  Am_Object::~Am_Object(&local_270);
  Am_Object::~Am_Object(&local_238);
  Am_Formula::~Am_Formula(&local_250);
  Am_Object::~Am_Object(&local_240);
  Am_Object::~Am_Object(&local_1f8);
  Am_Formula::~Am_Formula(&local_230);
  Am_Formula::~Am_Formula(&local_220);
  Am_Formula::~Am_Formula(&local_210);
  Am_Object::~Am_Object(&local_200);
  Am_Object::~Am_Object(&local_1c8);
  Am_Formula::~Am_Formula(&local_1f0);
  Am_Formula::~Am_Formula(&local_1e0);
  Am_Object::~Am_Object(&local_1d0);
  Am_Object::~Am_Object(&local_188);
  Am_Object::~Am_Object(&local_190);
  Am_Object::~Am_Object(&local_198);
  Am_Formula::~Am_Formula(&local_1c0);
  Am_Formula::~Am_Formula(&local_1b0);
  Am_Object::~Am_Object(&local_1a0);
  Am_Object::~Am_Object(&local_150);
  Am_Object::~Am_Object(&local_158);
  Am_Object::~Am_Object(&local_160);
  Am_Formula::~Am_Formula(&local_180);
  Am_Font::~Am_Font(&local_170);
  Am_Object::~Am_Object(&local_168);
  Am_Object::~Am_Object(&local_128);
  Am_Font::~Am_Font(&local_148);
  Am_Formula::~Am_Formula(&local_140);
  Am_Object::~Am_Object(&local_130);
  Am_Object::~Am_Object(&local_118);
  Am_Object::~Am_Object(&local_120);
  Am_Object::Get_Object(&local_310,(Am_Slot_Key)&local_110,0x1d2);
  pAVar2 = Am_Object::Set(&local_310,0x96,-4,0);
  Am_Object::Get_Object(&local_308,(Am_Slot_Key)pAVar2,0xa5);
  Am_Object::Set(&local_308,0x84,false,0);
  Am_Object::~Am_Object(&local_308);
  Am_Object::~Am_Object(&local_310);
  Am_Object::Get_Object(&local_318,(Am_Slot_Key)&local_110,0xc5);
  pAVar4 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&am_clear_select_line_part);
  Am_Object::Set(&local_318,0xca,pAVar4,0);
  Am_Object::~Am_Object(&local_318);
  pAVar2 = Am_Object::Set(&Am_Script_Window,0xa1,0x1e,0);
  AVar1 = Am_UNDO_OPTIONS;
  Am_Object::Create(&local_328,(char *)&Am_Button_Panel);
  pAVar7 = Am_Formula::operator_cast_to_Am_Constraint_(&Am_Center_X_Is_Center_Of_Owner);
  pAVar3 = Am_Object::Set(&local_328,100,pAVar7,0);
  pAVar7 = Am_Formula::operator_cast_to_Am_Constraint_(&Am_Bottom_Is_Bottom_Of_Owner);
  pAVar3 = Am_Object::Set(pAVar3,0x65,pAVar7,0);
  pAVar5 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_Motif_Light_Green);
  pAVar3 = Am_Object::Set(pAVar3,0x6a,pAVar5,0);
  pAVar7 = Am_Formula::operator_cast_to_Am_Constraint_(&Am_Horizontal_Layout);
  pAVar3 = Am_Object::Set(pAVar3,0x94,pAVar7,0);
  pAVar3 = Am_Object::Set(pAVar3,0x95,5,0);
  pAVar3 = Am_Object::Set(pAVar3,0x99,false,0);
  Am_Value_List::Am_Value_List(&local_338);
  Am_Object::Create(&local_340,(char *)&Am_Command);
  pAVar9 = Am_Object::Set(&local_340,0x150,"OK",0);
  pAVar9 = Am_Object::Set(pAVar9,0x154,-1,0);
  pAVar4 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&am_script_ok);
  pAVar9 = Am_Object::Set(pAVar9,0xca,pAVar4,0);
  pAVar5 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar9);
  pAVar6 = Am_Value_List::Add(&local_338,pAVar5,Am_TAIL,true);
  Am_Object::Create(&local_348,(char *)&Am_Command);
  pAVar9 = Am_Object::Set(&local_348,0x150,"Cancel",0);
  pAVar9 = Am_Object::Set(pAVar9,0x154,-1,0);
  pAVar4 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&script_window_cancel);
  pAVar9 = Am_Object::Set(pAVar9,0xca,pAVar4,0);
  pAVar5 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar9);
  pAVar6 = Am_Value_List::Add(pAVar6,pAVar5,Am_TAIL,true);
  Am_Object::Create(&local_350,(char *)&Am_Command);
  pAVar9 = Am_Object::Set(&local_350,0x150,"Remove",0);
  pAVar7 = Am_Formula::operator_cast_to_Am_Constraint_(&ok_to_remove_formula);
  pAVar9 = Am_Object::Set(pAVar9,0xcc,pAVar7,0);
  pAVar9 = Am_Object::Set(pAVar9,0x154,-1,0);
  pAVar4 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&am_script_remove);
  pAVar9 = Am_Object::Set(pAVar9,0xca,pAVar4,0);
  pAVar5 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar9);
  pAVar6 = Am_Value_List::Add(pAVar6,pAVar5,Am_TAIL,true);
  Am_Object::Create(&local_358,(char *)&Am_Command);
  pAVar9 = Am_Object::Set(&local_358,0x150,"Execute",0);
  pAVar9 = Am_Object::Set(pAVar9,0x154,-1,0);
  pAVar4 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&am_script_execute);
  pAVar9 = Am_Object::Set(pAVar9,0xca,pAVar4,0);
  pAVar5 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar9);
  pAVar6 = Am_Value_List::Add(pAVar6,pAVar5,Am_TAIL,true);
  Am_Object::Create(&local_360,(char *)&Am_Command);
  pAVar9 = Am_Object::Set(&local_360,0x150,"Step",0);
  pAVar9 = Am_Object::Set(pAVar9,0x154,-1,0);
  pAVar4 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&am_execute_script_step_one);
  pAVar9 = Am_Object::Set(pAVar9,0xca,pAVar4,0);
  pAVar5 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar9);
  pAVar6 = Am_Value_List::Add(pAVar6,pAVar5,Am_TAIL,true);
  Am_Object::Create(&local_368,(char *)&Am_Command);
  pAVar9 = Am_Object::Set(&local_368,0x150,"Select Members",0);
  pAVar9 = Am_Object::Set(pAVar9,0x154,-1,0);
  pAVar4 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&am_script_select_members);
  pAVar9 = Am_Object::Set(pAVar9,0xca,pAVar4,0);
  pAVar5 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar9);
  pAVar6 = Am_Value_List::Add(pAVar6,pAVar5,Am_TAIL,true);
  pAVar5 = Am_Value_List::operator_cast_to_Am_Wrapper_(pAVar6);
  pAVar3 = Am_Object::Set(pAVar3,0xa2,pAVar5,0);
  Am_Object::Am_Object(&local_320,pAVar3);
  pAVar2 = Am_Object::Add_Part(pAVar2,AVar1,&local_320,0);
  AVar1 = Am_EXECUTE_COUNTER;
  Am_Object::Create(&local_378,(char *)&Am_Number_Input_Widget);
  pAVar3 = Am_Object::Set(&local_378,100,200,0);
  Am_Bottom_Of_Sibling((Am_Slot_Key)&local_388,(uint)Am_UNDO_OPTIONS,1.0);
  pAVar7 = Am_Formula::operator_cast_to_Am_Constraint_(&local_388);
  pAVar3 = Am_Object::Set(pAVar3,0x65,pAVar7,0);
  pAVar3 = Am_Object::Set(pAVar3,0x169,0,0);
  pAVar5 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_Motif_Light_Green);
  pAVar3 = Am_Object::Set(pAVar3,0x6a,pAVar5,0);
  Am_Object::Create(&local_390,(char *)&Am_Command);
  pAVar9 = Am_Object::Set(&local_390,0x150,"Count",0);
  pAVar4 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&count_set);
  pAVar9 = Am_Object::Set(pAVar9,0xca,pAVar4,0);
  pAVar5 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar9);
  pAVar3 = Am_Object::Set(pAVar3,0xc5,pAVar5,0);
  pAVar3 = Am_Object::Set(pAVar3,0x66,0x50,0);
  pAVar3 = Am_Object::Set(pAVar3,0x169,1,0);
  Am_Object::Am_Object(&local_370,pAVar3);
  pAVar2 = Am_Object::Add_Part(pAVar2,AVar1,&local_370,0);
  Am_Object::Create(&local_3a0,(char *)&Am_One_Shot_Interactor);
  pAVar3 = Am_Object::Set(&local_3a0,0xb9,"Control_u",0);
  pAVar4 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&increment_counter);
  pAVar3 = Am_Object::Set(pAVar3,0xca,pAVar4,0);
  Am_Object::Am_Object(&local_398,pAVar3);
  pAVar2 = Am_Object::Add_Part(pAVar2,&local_398,true,0);
  Am_Object::Create(&local_3a8,(char *)&Am_Tab_To_Next_Widget_Interactor);
  Am_Object::Add_Part(pAVar2,&local_3a8,true,0);
  Am_Object::~Am_Object(&local_3a8);
  Am_Object::~Am_Object(&local_398);
  Am_Object::~Am_Object(&local_3a0);
  Am_Object::~Am_Object(&local_370);
  Am_Object::~Am_Object(&local_390);
  Am_Formula::~Am_Formula(&local_388);
  Am_Object::~Am_Object(&local_378);
  Am_Object::~Am_Object(&local_320);
  Am_Object::~Am_Object(&local_368);
  Am_Object::~Am_Object(&local_360);
  Am_Object::~Am_Object(&local_358);
  Am_Object::~Am_Object(&local_350);
  Am_Object::~Am_Object(&local_348);
  Am_Object::~Am_Object(&local_340);
  Am_Value_List::~Am_Value_List(&local_338);
  Am_Object::~Am_Object(&local_328);
  Am_Object::Am_Object((Am_Object *)in_RDI,&Am_Script_Window);
  Am_Object::~Am_Object(&local_110);
  Am_Value_List::~Am_Value_List((Am_Value_List *)local_20);
  return (Am_Object)in_RDI;
}

Assistant:

Am_Object
Am_Script_Window_Initialize()
{
  Am_Value_List l;
  l.Add(Am_Command.Create(DSTR("File"))
            .Set(Am_LABEL, "File")
            .Set(Am_IMPLEMENTATION_PARENT, true) //not undoable
            .Set(Am_ITEMS,
                 Am_Value_List()
                     .Add(Am_Standard_OK_Command.Create()
                              .Set(Am_IMPLEMENTATION_PARENT,
                                   Am_NOT_USUALLY_UNDONE)
                              .Set(Am_DO_METHOD, am_script_ok))
                     .Add(Am_Command.Create(DSTR("Cancel"))
                              .Set(Am_LABEL, "Cancel")
                              .Set(Am_IMPLEMENTATION_PARENT,
                                   Am_NOT_USUALLY_UNDONE)
                              .Set(Am_DO_METHOD, script_window_cancel))
                     .Add(Am_Command.Create(DSTR("Remove"))
                              .Set(Am_LABEL, "Remove Script")
                              .Set(Am_ACTIVE, ok_to_remove_formula)
                              .Set(Am_IMPLEMENTATION_PARENT,
                                   Am_NOT_USUALLY_UNDONE)
                              .Set(Am_DO_METHOD, am_script_remove))
                     .Add(Am_Command.Create(DSTR("Execute"))
                              .Set(Am_LABEL, "Execute Script")
                              .Set(Am_IMPLEMENTATION_PARENT,
                                   Am_NOT_USUALLY_UNDONE)
                              .Set(Am_DO_METHOD, am_script_execute))
                     .Add(Am_Command.Create(DSTR("select_members"))
                              .Set(Am_LABEL, "Select Members")
                              .Set(Am_IMPLEMENTATION_PARENT,
                                   Am_NOT_USUALLY_UNDONE)
                              .Set(Am_DO_METHOD, am_script_select_members))
                     .Add(Am_Menu_Line_Command.Create())
                     .Add(Am_About_Amulet_Command.Create())))
      .Add(
          Am_Command.Create(DSTR("Edit_Command"))
              .Set(Am_LABEL, "Edit")
              .Set(Am_IMPLEMENTATION_PARENT, true) //not undoable
              .Set(
                  Am_ITEMS,
                  Am_Value_List()
                      .Add(Am_Undo_Command.Create())
                      .Add(Am_Redo_Command.Create())
                      .Add(Am_Command.Create(DSTR("Cut"))
                               .Set(Am_LABEL, "Cut")
                               .Set(Am_ACTIVE, false))
                      .Add(Am_Command.Create(DSTR("Copy"))
                               .Set(Am_LABEL, "Copy")
                               .Set(Am_ACTIVE, false))
                      .Add(Am_Command.Create(DSTR("Paste"))
                               .Set(Am_LABEL, "Paste")
                               .Set(Am_ACTIVE, false))
                      .Add(Am_Command.Create(DSTR("Insert Commands Before"))
                               .Set(Am_LABEL, "Insert Commands Before")
                               .Set(Am_ACTIVE, am_insert_commands_ok)
                               .Set(Am_DO_METHOD, am_insert_commands_before)
                               .Set(Am_UNDO_METHOD, am_edit_commands_list_undo)
                               .Set(Am_REDO_METHOD, am_edit_commands_list_undo))
                      .Add(Am_Command.Create(DSTR("Insert Commands After"))
                               .Set(Am_LABEL, "Insert Commands After")
                               .Set(Am_ACTIVE, am_insert_commands_ok)
                               .Set(Am_DO_METHOD, am_insert_commands_after)
                               .Set(Am_UNDO_METHOD, am_edit_commands_list_undo)
                               .Set(Am_REDO_METHOD, am_edit_commands_list_undo))
                      .Add(Am_Command.Create(DSTR("Delete"))
                               .Set(Am_LABEL, "Delete Commands")
                               .Set(Am_ACTIVE, am_delete_commands_ok)
                               .Set(Am_DO_METHOD, am_delete_script_commands)
                               .Set(Am_UNDO_METHOD, am_edit_commands_list_undo)
                               .Set(Am_REDO_METHOD, am_edit_commands_list_undo))
                      .Add(Am_Menu_Line_Command.Create())
                      .Add(Am_Command.Create(DSTR("Generalize"))
                               .Set(Am_LABEL, "Generalize")
                               .Set(Am_ACTIVE, am_generalize_script_active)
                               .Set(Am_DO_METHOD, am_do_generalize_script))
                      .Add(Am_Menu_Line_Command.Create())
                      .Add(Am_Command.Create(DSTR("Invoke"))
                               .Set(Am_LABEL, "How Invoked...")
                               .Set(Am_DO_METHOD, pop_up_invoke_options))));
  Am_Script_Window =
      Am_Window.Create(DSTR("Am_Script_Window"))
          .Set(Am_DESTROY_WINDOW_METHOD, script_window_destroy_method)
          .Set(Am_FILL_STYLE, Am_Motif_Light_Green)
          .Set(Am_TITLE, "Script for Commands")
          .Set(Am_ICON_TITLE, "Script Commands")
          .Set(Am_WIDTH, 530)
          .Set(Am_HEIGHT, 400)
          .Set(Am_VISIBLE, false)
          .Add(Am_SCRIPT_EXECUTE_COMMAND, Am_No_Object)
          .Add(Am_SHOW_SCRIPT_COMMAND, Am_No_Object)
          //undo operations in undo window!  weird
          .Set(Am_UNDO_HANDLER, Am_Multiple_Undo_Object.Create());
  Am_Object sg;
  Am_Script_Window
      .Add_Part(Am_UNDO_MENU_BAR, Am_Menu_Bar.Create()
                                      .Set(Am_FILL_STYLE, Am_Motif_Light_Green)
                                      .Set(Am_ITEMS, l))
      .Add_Part(Am_LABEL,
                Am_Text.Create()
                    .Set(Am_LEFT, 4)
                    .Set(Am_TOP, Am_Bottom_Of_Sibling(Am_UNDO_MENU_BAR, 5))
                    .Set(Am_WIDTH, 210)
                    .Set(Am_HEIGHT, 19)
                    .Set(Am_TEXT, "Script Editor")
                    .Set(Am_FONT, Am_Font(Am_FONT_FIXED, true, false, false,
                                          Am_FONT_LARGE))
                    .Set(Am_LINE_STYLE, Am_Black)
                    .Set(Am_FILL_STYLE, Am_Motif_Light_Green))
      .Add_Part(Am_NAME_OBJECT,
                Am_Text_Input_Widget.Create()
                    .Set(Am_FONT, Am_Font(Am_FONT_FIXED, true))
                    .Set(Am_LEFT, 10)
                    .Set(Am_TOP, Am_Bottom_Of_Sibling(Am_LABEL, 5))
                    .Set(Am_WIDTH, 212)
                    .Set(Am_HEIGHT, 25)
                    .Get_Object(Am_COMMAND)
                    .Set(Am_LABEL, "Script Name:")
                    .Get_Owner()
                    .Set(Am_FILL_STYLE, Am_Motif_Light_Green))
      .Add_Part(Am_ACCELERATOR,
                Am_Button.Create(DSTR("popup how invoke"))
                    .Set(Am_LEAVE_ROOM_FOR_FRINGE, false)
                    .Set(Am_LEFT, Am_Right_Of_Sibling(Am_NAME_OBJECT, 35))
                    .Set(Am_TOP, Am_From_Sibling(Am_NAME_OBJECT, Am_TOP))
                    .Get_Object(Am_COMMAND)
                    .Set(Am_LABEL, "How Invoked...")
                    .Set(Am_DO_METHOD, pop_up_invoke_options)
                    .Get_Owner()
                    .Set(Am_FILL_STYLE, Am_Motif_Light_Green))
      .Add_Part(Am_Text.Create(DSTR("invoke_feedback"))
                    .Set(Am_LEFT, Am_Right_Of_Sibling(Am_ACCELERATOR, 8))
                    .Set(Am_TOP, Am_From_Sibling(Am_NAME_OBJECT, Am_TOP))
                    .Set(Am_TEXT, gen_how_invoke_text))
      .Add_Part(Am_Border_Rectangle.Create()
                    .Set(Am_LEFT, 10)
                    .Set(Am_TOP, Am_Bottom_Of_Sibling(Am_ACCELERATOR, 5))
                    .Set(Am_WIDTH, Am_From_Owner(Am_WIDTH, -20))
                    .Set(Am_HEIGHT, Am_Rest_Of_Height_Above(Am_UNDO_OPTIONS, 6))
                    .Set(Am_SELECTED, 0)
                    .Set(Am_FILL_STYLE, Am_Motif_Light_Green))
      .Add_Part(Am_SHORT_LABEL,
                Am_Text.Create()
                    .Set(Am_LEFT, 16)
                    .Set(Am_TOP, Am_Bottom_Of_Sibling(Am_ACCELERATOR, 8))
                    .Set(Am_TEXT, "Commands:")
                    .Set(Am_LINE_STYLE, Am_Black))
      .Add_Part(
          Am_UNDO_SCROLL_GROUP,
          sg =
              Am_Scrolling_Menu.Create(DSTR("cmds_in_script"))
                  .Set(Am_LEFT, 18)
                  .Set(Am_TOP, Am_Bottom_Of_Sibling(Am_SHORT_LABEL, 3))
                  .Set(Am_WIDTH, Am_From_Owner(Am_WIDTH, -34))
                  .Set(Am_HEIGHT, Am_Rest_Of_Height_Above(Am_UNDO_OPTIONS, 15))
                  .Set(Am_FILL_STYLE, Am_Motif_Light_Green)
                  .Set(Am_H_SCROLL_BAR, true)
                  .Get_Object(Am_COMMAND)
                  .Set(Am_IMPLEMENTATION_PARENT, Am_NOT_USUALLY_UNDONE)
                  .Get_Owner()
                  .Add_Part(
                      Am_INTERACTOR,
                      Am_One_Shot_Interactor.Create(DSTR("select_line_part"))
                          .Set(Am_START_WHEN, Am_Input_Char("left_down"))
                          .Set(Am_PRIORITY, 10.0)
                          .Set(Am_START_WHERE_TEST, am_on_selectable_line_part)
                          .Get_Object(Am_COMMAND)
                          .Set(Am_DO_METHOD, am_select_line_part)
                          .Set(Am_IMPLEMENTATION_PARENT, Am_NOT_USUALLY_UNDONE)
                          .Get_Owner())
                  .Add_Part(
                      Am_ARROW_INTERACTOR,
                      Am_One_Shot_Interactor.Create(DSTR("double_clk"))
                          .Set(Am_START_WHEN, Am_Input_Char("double_left_down"))
                          .Set(Am_PRIORITY, 10.0)
                          .Set(Am_START_WHERE_TEST, am_on_selectable_line_part)
                          .Get_Object(Am_COMMAND)
                          .Set(Am_DO_METHOD, am_generalize_script_double_click)
                          .Set(Am_IMPLEMENTATION_PARENT, Am_NOT_USUALLY_UNDONE)
                          .Get_Owner()));
  sg.Get_Object(Am_SUB_MENU)
      .Set(Am_V_SPACING, -4)
      .Get_Object(Am_ITEM_PROTOTYPE)
      .Set(Am_PRETEND_TO_BE_LEAF, false);
  sg.Get_Object(Am_COMMAND).Set(Am_DO_METHOD, am_clear_select_line_part);
  Am_Script_Window.Set(Am_BOTTOM_OFFSET, 30)
      .Add_Part(
          Am_UNDO_OPTIONS,
          Am_Button_Panel.Create()
              .Set(Am_LEFT, Am_Center_X_Is_Center_Of_Owner)
              .Set(Am_TOP, Am_Bottom_Is_Bottom_Of_Owner)
              .Set(Am_FILL_STYLE, Am_Motif_Light_Green)
              .Set(Am_LAYOUT, Am_Horizontal_Layout)
              .Set(Am_H_SPACING, 5)
              .Set(Am_FIXED_WIDTH, false)
              .Set(Am_ITEMS,
                   Am_Value_List()
                       .Add(Am_Command.Create(DSTR("OK-menu"))
                                .Set(Am_LABEL, "OK")
                                .Set(Am_IMPLEMENTATION_PARENT,
                                     Am_NOT_USUALLY_UNDONE)
                                .Set(Am_DO_METHOD, am_script_ok))
                       .Add(Am_Command.Create(DSTR("Cancel"))
                                .Set(Am_LABEL, "Cancel")
                                .Set(Am_IMPLEMENTATION_PARENT,
                                     Am_NOT_USUALLY_UNDONE)
                                .Set(Am_DO_METHOD, script_window_cancel))
                       .Add(Am_Command.Create(DSTR("Remove"))
                                .Set(Am_LABEL, "Remove")
                                .Set(Am_ACTIVE, ok_to_remove_formula)
                                .Set(Am_IMPLEMENTATION_PARENT,
                                     Am_NOT_USUALLY_UNDONE)
                                .Set(Am_DO_METHOD, am_script_remove))
                       .Add(Am_Command.Create(DSTR("Execute"))
                                .Set(Am_LABEL, "Execute")
                                .Set(Am_IMPLEMENTATION_PARENT,
                                     Am_NOT_USUALLY_UNDONE)
                                .Set(Am_DO_METHOD, am_script_execute))
                       .Add(Am_Command.Create(DSTR("Step"))
                                .Set(Am_LABEL, "Step")
                                .Set(Am_IMPLEMENTATION_PARENT,
                                     Am_NOT_USUALLY_UNDONE)
                                .Set(Am_DO_METHOD, am_execute_script_step_one))
                       .Add(Am_Command.Create(DSTR("select_members"))
                                .Set(Am_LABEL, "Select Members")
                                .Set(Am_IMPLEMENTATION_PARENT,
                                     Am_NOT_USUALLY_UNDONE)
                                .Set(Am_DO_METHOD, am_script_select_members))))
      .Add_Part(Am_EXECUTE_COUNTER,
                Am_Number_Input_Widget.Create()
                    .Set(Am_LEFT, 200)
                    .Set(Am_TOP, Am_Bottom_Of_Sibling(Am_UNDO_OPTIONS, 2))
                    .Set(Am_VALUE, 0)
                    .Set(Am_FILL_STYLE, Am_Motif_Light_Green)
                    .Set(Am_COMMAND, Am_Command.Create()
                                         .Set(Am_LABEL, "Count")
                                         .Set(Am_DO_METHOD, count_set))
                    .Set(Am_WIDTH, 80)
                    .Set(Am_VALUE, 1))
      .Add_Part(Am_One_Shot_Interactor.Create(DSTR("incrementer"))
                    .Set(Am_START_WHEN, "Control_u")
                    .Set(Am_DO_METHOD, increment_counter))
      .Add_Part(Am_Tab_To_Next_Widget_Interactor.Create());
  return Am_Script_Window;
}